

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseNameAndCompare(xmlParserCtxtPtr ctxt,xmlChar *other)

{
  byte *pbVar1;
  byte *pbVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  byte *pbVar6;
  byte bVar7;
  byte *pbVar8;
  byte bVar9;
  
  pxVar3 = ctxt->input;
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar3 = ctxt->input;
  }
  pbVar2 = pxVar3->cur;
  bVar7 = *pbVar2;
  pbVar6 = pbVar2;
  pbVar8 = other;
  while (bVar7 != 0) {
    bVar9 = *pbVar8;
    if (bVar7 != bVar9) goto LAB_001429bd;
    pbVar8 = pbVar8 + 1;
    pbVar1 = pbVar6 + 1;
    pbVar6 = pbVar6 + 1;
    bVar7 = *pbVar1;
  }
  bVar9 = *pbVar8;
  bVar7 = 0;
LAB_001429bd:
  if (((bVar9 == 0) && (bVar7 < 0x3f)) && ((0x4000000100002600U >> ((ulong)bVar7 & 0x3f) & 1) != 0))
  {
    pxVar3->col = pxVar3->col + ((int)pbVar6 - (int)pbVar2);
    pxVar3->cur = pbVar6;
    pxVar5 = &DAT_00000001;
  }
  else {
    pxVar4 = xmlParseName(ctxt);
    pxVar5 = &DAT_00000001;
    if (pxVar4 != other) {
      pxVar5 = pxVar4;
    }
  }
  return pxVar5;
}

Assistant:

static const xmlChar *
xmlParseNameAndCompare(xmlParserCtxtPtr ctxt, xmlChar const *other) {
    register const xmlChar *cmp = other;
    register const xmlChar *in;
    const xmlChar *ret;

    GROW;

    in = ctxt->input->cur;
    while (*in != 0 && *in == *cmp) {
	++in;
	++cmp;
    }
    if (*cmp == 0 && (*in == '>' || IS_BLANK_CH (*in))) {
	/* success */
	ctxt->input->col += in - ctxt->input->cur;
	ctxt->input->cur = in;
	return (const xmlChar*) 1;
    }
    /* failure (or end of input buffer), check with full function */
    ret = xmlParseName (ctxt);
    /* strings coming from the dictionary direct compare possible */
    if (ret == other) {
	return (const xmlChar*) 1;
    }
    return ret;
}